

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::processFinished(QProcessPrivate *this)

{
  QProcessPrivate *this_00;
  EVP_PKEY_CTX *in_RSI;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  QProcess *q;
  ExitStatus in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QString *description;
  QProcessPrivate *in_stack_ffffffffffffffc0;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)q_func(in_RDI);
  waitForDeadChild(this_00);
  cleanup(in_RDI,in_RSI);
  if (in_RDI->exitStatus == '\x01') {
    description = &local_20;
    QString::QString((QString *)0x790413);
    setErrorAndEmit(in_stack_ffffffffffffffc0,(ProcessError)((ulong)in_RDI >> 0x20),description);
    QString::~QString((QString *)0x790433);
  }
  QIODevice::readChannelFinished((QIODevice *)0x79045d);
  QProcess::finished((QProcess *)0x790479,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessPrivate::processFinished()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished()");
#endif

#ifdef Q_OS_UNIX
    waitForDeadChild();
#else
    findExitCode();
#endif

    cleanup();

    if (exitStatus == QProcess::CrashExit)
        setErrorAndEmit(QProcess::Crashed);

    // we received EOF now:
    emit q->readChannelFinished();
    // in the future:
    //emit q->standardOutputClosed();
    //emit q->standardErrorClosed();

    emit q->finished(exitCode, QProcess::ExitStatus(exitStatus));

#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished(): process is dead");
#endif
}